

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O3

void __thiscall
google::protobuf::internal::ArenaImpl::ArenaImpl<google::protobuf::ArenaOptions>
          (ArenaImpl *this,ArenaOptions *options)

{
  ulong uVar1;
  size_t sVar2;
  _func_void_void_ptr_size_t *p_Var3;
  Block *pBVar4;
  LogMessage *pLVar5;
  LogMessage local_58;
  LogFinisher local_19;
  
  sVar2 = options->max_block_size;
  (this->options_).start_block_size = options->start_block_size;
  (this->options_).max_block_size = sVar2;
  pBVar4 = (Block *)options->initial_block;
  (this->options_).initial_block = (char *)pBVar4;
  uVar1 = options->initial_block_size;
  (this->options_).initial_block_size = uVar1;
  p_Var3 = options->block_dealloc;
  (this->options_).block_alloc = options->block_alloc;
  (this->options_).block_dealloc = p_Var3;
  if (uVar1 == 0 || pBVar4 == (Block *)0x0) {
    pBVar4 = (Block *)0x0;
  }
  else if (uVar1 < 0x18) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/arena_impl.h"
               ,0x59);
    pLVar5 = LogMessage::operator<<
                       (&local_58,"CHECK failed: (options_.initial_block_size) >= (sizeof(Block)): "
                       );
    pLVar5 = LogMessage::operator<<(pLVar5,": Initial block size too small for header.");
    LogFinisher::operator=(&local_19,pLVar5);
    LogMessage::~LogMessage(&local_58);
    pBVar4 = (Block *)(this->options_).initial_block;
  }
  this->initial_block_ = pBVar4;
  Init(this);
  return;
}

Assistant:

explicit ArenaImpl(const O& options) : options_(options) {
    if (options_.initial_block != NULL && options_.initial_block_size > 0) {
      GOOGLE_CHECK_GE(options_.initial_block_size, sizeof(Block))
          << ": Initial block size too small for header.";
      initial_block_ = reinterpret_cast<Block*>(options_.initial_block);
    } else {
      initial_block_ = NULL;
    }

    Init();
  }